

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O3

void __thiscall front::syntax::SyntaxAnalyze::gm_const_def(SyntaxAnalyze *this)

{
  uint uVar1;
  pointer pWVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  pointer psVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  ulong uVar10;
  ArraySymbol *this_00;
  IntSymbol *this_01;
  pointer psVar11;
  SyntaxAnalyze *pSVar12;
  _Alloc_hider _Var13;
  _Base_ptr p_Var14;
  SharedSyPtr symbol;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inits;
  string name;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  init_values;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  dimensions;
  __shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> local_1c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1b8;
  SyntaxAnalyze *local_1a0;
  undefined1 *local_198;
  long local_190;
  undefined1 local_188;
  undefined7 uStack_187;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  local_178;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  local_158;
  value_type local_138;
  undefined1 local_128 [32];
  SharedSyPtr local_108;
  value_type local_f8;
  value_type local_e8;
  string local_d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  SharedSyPtr local_a0;
  undefined1 local_90 [32];
  undefined1 local_70 [32];
  string local_50;
  
  local_198 = &local_188;
  local_190 = 0;
  local_188 = 0;
  local_1c8._M_ptr = (element_type *)0x0;
  local_1c8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_138.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_138.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_178.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint32_t *)0x0;
  local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  match_one_word(this,IDENFR);
  word::Word::get_self_abi_cxx11_
            ((string *)local_128,
             (this->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start + this->matched_index);
  std::__cxx11::string::operator=((string *)&local_198,(string *)local_128);
  if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  uVar10 = this->matched_index + 1;
  pWVar2 = (this->word_list->
           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((uVar10 < (ulong)(((long)(this->word_list->
                               super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar2 >> 4) *
                       -0x5555555555555555)) &&
     (bVar8 = word::Word::match_token(pWVar2 + uVar10,LBRACK), bVar8)) {
    while( true ) {
      uVar10 = this->matched_index + 1;
      pWVar2 = (this->word_list->
               super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar8 = true;
      if (((ulong)(((long)(this->word_list->
                          super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pWVar2 >> 4) *
                  -0x5555555555555555) <= uVar10) ||
         (bVar9 = word::Word::match_token(pWVar2 + uVar10,LBRACK), !bVar9)) break;
      match_one_word(this,LBRACK);
      gm_exp((SyntaxAnalyze *)local_128);
      uVar7 = local_128._8_8_;
      local_138.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_128._0_8_;
      _Var5._M_pi = local_138.
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      local_128._0_8_ = (pointer)0x0;
      local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_138.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
      if ((_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
      }
      match_one_word(this,RBRACK);
      std::
      vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ::push_back(&local_158,&local_138);
    }
  }
  else {
    bVar8 = false;
  }
  match_one_word(this,ASSIGN);
  uVar10 = this->matched_index + 1;
  pWVar2 = (this->word_list->
           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((uVar10 < (ulong)(((long)(this->word_list->
                               super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar2 >> 4) *
                       -0x5555555555555555)) &&
     (bVar9 = word::Word::match_token(pWVar2 + uVar10,LBRACE), bVar9)) {
    match_one_word(this,LBRACE);
    gm_const_init_val(this,&local_178,&local_158,0);
    match_one_word(this,RBRACE);
  }
  else {
    gm_const_init_val(this,&local_178,&local_158,0);
  }
  psVar6 = local_178.
           super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1a0 = this;
  if (local_178.
      super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_178.
      super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    psVar11 = local_178.
              super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      peVar3 = (psVar11->super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      p_Var4 = (psVar11->super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
               )._M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      uVar1 = peVar3->_value;
      local_128._0_4_ = uVar1;
      if (local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_1b8,
                   (iterator)
                   local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish,(uint *)local_128);
      }
      else {
        *local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar1;
        local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
      psVar11 = psVar11 + 1;
    } while (psVar11 != psVar6);
  }
  if (bVar8) {
    this_00 = (ArraySymbol *)operator_new(0x78);
    pSVar12 = local_1a0;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_198,local_198 + local_190);
    front::symbol::IntSymbol::getHolderIntSymbol();
    front::symbol::ArraySymbol::ArraySymbol
              (this_00,&local_d8,&local_a0,pSVar12->layer_num,true,false);
    std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
    reset<front::symbol::ArraySymbol>(&local_1c8,this_00);
    if (local_a0.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    psVar6 = local_158.
             super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_158.
        super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_158.
        super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      psVar11 = local_158.
                super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        _Var5._M_pi = local_1c8._M_refcount._M_pi;
        local_e8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (psVar11->super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
        p_Var4 = (psVar11->
                 super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          }
        }
        if (local_1c8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_1c8._M_refcount._M_pi)->_M_use_count =
                 (local_1c8._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_1c8._M_refcount._M_pi)->_M_use_count =
                 (local_1c8._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          }
        }
        local_e8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var4;
        std::
        vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
        ::push_back((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                     *)&local_1c8._M_ptr[1]._name.field_2,&local_e8);
        if (local_e8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e8.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
        }
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        }
        psVar11 = psVar11 + 1;
      } while (psVar11 != psVar6);
    }
    psVar6 = local_178.
             super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_178.
        super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_178.
        super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      psVar11 = local_178.
                super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        _Var5._M_pi = local_1c8._M_refcount._M_pi;
        local_f8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (psVar11->super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
        p_Var4 = (psVar11->
                 super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          }
        }
        if (local_1c8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_1c8._M_refcount._M_pi)->_M_use_count =
                 (local_1c8._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_1c8._M_refcount._M_pi)->_M_use_count =
                 (local_1c8._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          }
        }
        local_f8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var4;
        std::
        vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
        ::push_back((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                     *)(local_1c8._M_ptr + 2),&local_f8);
        if (local_f8.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_f8.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
        }
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        }
        psVar11 = psVar11 + 1;
      } while (psVar11 != psVar6);
    }
    p_Var14 = (_Base_ptr)(local_70 + 0x10);
    local_70._0_8_ = p_Var14;
    std::__cxx11::string::_M_construct<char*>((string *)local_70,local_198,local_198 + local_190);
    pSVar12 = local_1a0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_b8,&local_1b8);
    irGenerator::irGenerator::ir_declare_const
              (&pSVar12->irGenerator,(string *)local_70,&local_b8,(local_1c8._M_ptr)->id);
    _Var13._M_p = (pointer)local_70._0_8_;
    if ((element_type *)
        local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (element_type *)0x0) {
      operator_delete(local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      _Var13._M_p = (pointer)local_70._0_8_;
    }
  }
  else {
    this_01 = (IntSymbol *)operator_new(0x40);
    pSVar12 = local_1a0;
    local_90._0_8_ = (_Base_ptr)(local_90 + 0x10);
    std::__cxx11::string::_M_construct<char*>((string *)local_90,local_198,local_198 + local_190);
    front::symbol::IntSymbol::IntSymbol
              (this_01,(string *)local_90,pSVar12->layer_num,true,
               (((local_178.
                  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
               ->_value);
    std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
    reset<front::symbol::IntSymbol>(&local_1c8,this_01);
    if ((_Base_ptr)local_90._0_8_ != (_Base_ptr)(local_90 + 0x10)) {
      operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
    }
    p_Var14 = (_Base_ptr)&local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)p_Var14;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_198,local_198 + local_190);
    irGenerator::irGenerator::ir_declare_const
              (&pSVar12->irGenerator,&local_50,
               *local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start,(local_1c8._M_ptr)->id);
    _Var13._M_p = local_50._M_dataplus._M_p;
  }
  if ((_Base_ptr)_Var13._M_p != p_Var14) {
    operator_delete(_Var13._M_p,*(size_type *)p_Var14 + 1);
  }
  local_108.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_1c8._M_ptr;
  local_108.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = local_1c8._M_refcount._M_pi;
  if (local_1c8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1c8._M_refcount._M_pi)->_M_use_count = (local_1c8._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1c8._M_refcount._M_pi)->_M_use_count = (local_1c8._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  symbolTable::SymbolTable::push_symbol(&pSVar12->symbolTable,&local_108);
  if (local_108.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint32_t *)0x0) {
    operator_delete(local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::~vector(&local_158);
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::~vector(&local_178);
  if (local_138.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_1c8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c8._M_refcount._M_pi);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198,CONCAT71(uStack_187,local_188) + 1);
  }
  return;
}

Assistant:

void SyntaxAnalyze::gm_const_def() {
  string name;
  SymbolKind kind;
  SharedSyPtr symbol;
  SharedExNdPtr dimension;
  vector<SharedExNdPtr> init_values;
  vector<SharedExNdPtr> dimensions;
  vector<std::uint32_t> inits;

  match_one_word(Token::IDENFR);
  name = get_least_matched_word().get_self();

  if (try_word(1, Token::LBRACK)) {
    kind = SymbolKind::Array;
    while (try_word(1, Token::LBRACK)) {
      match_one_word(Token::LBRACK);
      dimension = gm_const_exp();
      match_one_word(Token::RBRACK);

      dimensions.push_back(dimension);
    }
  } else {
    kind = SymbolKind::INT;
  }

  match_one_word(Token::ASSIGN);

  if (try_word(1, Token::LBRACE)) {
    match_one_word(Token::LBRACE);
    gm_const_init_val(init_values, dimensions, 0);
    match_one_word(Token::RBRACE);
  } else {
    gm_const_init_val(init_values, dimensions, 0);
  }

  if (init_values.size() > 0) {
    for (auto i : init_values) {
      inits.push_back(i->_value);
    }
  }

  if (kind == SymbolKind::INT) {
    symbol.reset(
        new IntSymbol(name, layer_num, true, init_values.front()->_value));
    irGenerator.ir_declare_const(name, inits.front(), symbol->getId());
  } else {
    symbol.reset(new ArraySymbol(name, IntSymbol::getHolderIntSymbol(),
                                 layer_num, true, false));
    for (auto var : dimensions) {
      std::static_pointer_cast<ArraySymbol>(symbol)->addDimension(var);
    }
    for (auto value : init_values) {
      std::static_pointer_cast<ArraySymbol>(symbol)->addValue(value);
    }

    irGenerator.ir_declare_const(name, inits, symbol->getId());
  }

  symbolTable.push_symbol(symbol);
}